

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void __thiscall
QSslSocket::connectToHost
          (QSslSocket *this,QString *hostName,quint16 port,OpenMode openMode,
          NetworkLayerProtocol protocol)

{
  QSslSocketPrivate *this_00;
  QTcpSocket *this_01;
  qintptr qVar1;
  long in_FS_OFFSET;
  QAbstractSocket local_40;
  
  local_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.preferredNetworkLayerProtocol =
       protocol;
  if ((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f == '\0') {
    QSslSocketPrivate::init(this_00,(EVP_PKEY_CTX *)hostName);
  }
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 0;
  if (this_00->plainSocket == (QTcpSocket *)0x0) {
    QSslSocketPrivate::createPlainSocket(this_00,openMode);
  }
  QAbstractSocket::setProtocolTag
            (&this_00->plainSocket->super_QAbstractSocket,
             &(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.protocolTag);
  this_01 = this_00->plainSocket;
  QAbstractSocket::proxy(&local_40);
  QAbstractSocket::setProxy(&this_01->super_QAbstractSocket,(QNetworkProxy *)&local_40);
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_40);
  QIODevice::open(this,openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  *(undefined8 *)&(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = 0;
  (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0xf8))
            (this_00->plainSocket,hostName,port,
             openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
             (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.
             preferredNetworkLayerProtocol);
  qVar1 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x110))();
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_40._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::connectToHost(const QString &hostName, quint16 port, OpenMode openMode, NetworkLayerProtocol protocol)
{
    Q_D(QSslSocket);
    d->preferredNetworkLayerProtocol = protocol;
    if (!d->initialized)
        d->init();
    d->initialized = false;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::connectToHost("
             << hostName << ',' << port << ',' << openMode << ')';
#endif
    if (!d->plainSocket) {
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "\tcreating internal plain socket";
#endif
        d->createPlainSocket(openMode);
    }
#ifndef QT_NO_NETWORKPROXY
    d->plainSocket->setProtocolTag(d->protocolTag);
    d->plainSocket->setProxy(proxy());
#endif
    QIODevice::open(openMode);
    d->readChannelCount = d->writeChannelCount = 0;
    d->plainSocket->connectToHost(hostName, port, openMode, d->preferredNetworkLayerProtocol);
    d->cachedSocketDescriptor = d->plainSocket->socketDescriptor();
}